

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O3

Gia_Man_t * Gia_ManDupToBarBufs(Gia_Man_t *p,int nBarBufs)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  int *piVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  Gia_Obj_t *pGVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  
  if (p->nBufs != 0) {
    __assert_fail("Gia_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x138,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x139,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  if (p->pSibls == (int *)0x0) {
    __assert_fail("Gia_ManHasChoices(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x13a,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  iVar17 = p->vCis->nSize;
  iVar1 = p->vCos->nSize;
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar3);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar3);
  }
  p_00->pName = pcVar7;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar3);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar3);
  }
  uVar13 = iVar17 - nBarBufs;
  p_00->pSpec = pcVar7;
  if (p->pSibls != (int *)0x0) {
    piVar8 = (int *)calloc((long)p->nObjs,4);
    p_00->pSibls = piVar8;
  }
  Gia_ManFillValue(p);
  pGVar11 = p->pObjs;
  pGVar11->Value = 0;
  if ((int)uVar13 < 1) {
    uVar12 = (ulong)(uint)p->nObjs;
    if (p->nObjs < 1) {
      uVar18 = 0;
      goto LAB_007b6bd2;
    }
  }
  else {
    uVar18 = 0;
    do {
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar11 = p_00->pObjs;
      if ((pGVar9 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar9)) goto LAB_007b6dde;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar11) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_007b6dde;
      if ((long)p->vCis->nSize <= (long)uVar18) goto LAB_007b6d81;
      iVar17 = p->vCis->pArray[uVar18];
      if (((long)iVar17 < 0) || (uVar12 = (ulong)(uint)p->nObjs, p->nObjs <= iVar17))
      goto LAB_007b6da0;
      pGVar11 = p->pObjs;
      pGVar11[iVar17].Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
      uVar18 = uVar18 + 1;
    } while (uVar13 != uVar18);
  }
  lVar19 = 0;
  uVar18 = 0;
  do {
    if (pGVar11 == (Gia_Obj_t *)0x0) {
      pGVar11 = (Gia_Obj_t *)0x0;
      break;
    }
    pGVar9 = pGVar11 + lVar19;
    uVar14 = *(ulong *)pGVar9;
    uVar16 = uVar14 & 0x1fffffff;
    if (uVar16 != 0x1fffffff && -1 < (int)uVar14) {
      iVar17 = (int)uVar18;
      if (iVar17 < nBarBufs) {
        uVar18 = uVar18 & 0xffffffff;
        do {
          if (iVar17 < 0) goto LAB_007b6d81;
          if (p->vCos->nSize <= (int)uVar18) goto LAB_007b6d81;
          iVar2 = p->vCos->pArray[uVar18];
          if (((long)iVar2 < 0) || ((int)uVar12 <= iVar2)) goto LAB_007b6da0;
          uVar10 = (uint)*(undefined8 *)(pGVar11 + iVar2);
          uVar5 = (pGVar11 + iVar2)[-(ulong)(uVar10 & 0x1fffffff)].Value;
          if (uVar5 == 0xffffffff) goto LAB_007b6ad3;
          if ((int)uVar5 < 0) goto LAB_007b6dbf;
          uVar5 = Gia_ManAppendBuf(p_00,uVar5 ^ uVar10 >> 0x1d & 1);
          if ((int)(uVar13 + iVar17) < 0) goto LAB_007b6d81;
          uVar10 = uVar13 + (int)uVar18;
          if (p->vCis->nSize <= (int)uVar10) goto LAB_007b6d81;
          iVar2 = p->vCis->pArray[uVar10];
          if (((long)iVar2 < 0) || (uVar12 = (ulong)(uint)p->nObjs, p->nObjs <= iVar2))
          goto LAB_007b6da0;
          pGVar11 = p->pObjs;
          pGVar11[iVar2].Value = uVar5;
          uVar18 = uVar18 + 1;
        } while ((int)uVar18 < nBarBufs);
        uVar18 = (ulong)(uint)nBarBufs;
LAB_007b6ad3:
        uVar14 = *(ulong *)pGVar9;
        uVar16 = (ulong)((uint)uVar14 & 0x1fffffff);
      }
      if ((int)pGVar9[-uVar16].Value < 0) goto LAB_007b6dbf;
      uVar5 = (uint)(uVar14 >> 0x20);
      if ((int)pGVar9[-(ulong)(uVar5 & 0x1fffffff)].Value < 0) goto LAB_007b6dbf;
      uVar5 = Gia_ManAppendAnd(p_00,(uint)(uVar14 >> 0x1d) & 1 ^ pGVar9[-uVar16].Value,
                               pGVar9[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1);
      pGVar9->Value = uVar5;
      pGVar11 = p->pObjs;
      if (pGVar9 < pGVar11) {
LAB_007b6dde:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar12 = (ulong)p->nObjs;
      if (pGVar11 + uVar12 <= pGVar9) goto LAB_007b6dde;
      if (p->pSibls != (int *)0x0) {
        uVar10 = p->pSibls[(int)((ulong)((long)pGVar9 - (long)pGVar11) >> 2) * -0x55555555];
        if ((ulong)uVar10 != 0) {
          if (((int)uVar10 < 0) || (p->nObjs <= (int)uVar10)) goto LAB_007b6da0;
          if (((int)pGVar11[uVar10].Value < 0) || ((int)uVar5 < 0)) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          p_00->pSibls[uVar5 >> 1] = pGVar11[uVar10].Value >> 1;
          uVar12 = (ulong)(uint)p->nObjs;
        }
      }
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 < (int)uVar12);
LAB_007b6bd2:
  if ((int)uVar18 < nBarBufs) {
    uVar14 = uVar18 & 0xffffffff;
    do {
      if ((int)uVar18 < 0) goto LAB_007b6d81;
      if (p->vCos->nSize <= (int)uVar14) goto LAB_007b6d81;
      iVar17 = p->vCos->pArray[uVar14];
      if (((long)iVar17 < 0) || ((int)uVar12 <= iVar17)) goto LAB_007b6da0;
      uVar10 = (uint)*(undefined8 *)(pGVar11 + iVar17);
      uVar5 = (pGVar11 + iVar17)[-(ulong)(uVar10 & 0x1fffffff)].Value;
      if ((int)uVar5 < 0) goto LAB_007b6dbf;
      uVar5 = Gia_ManAppendBuf(p_00,uVar10 >> 0x1d & 1 ^ uVar5);
      uVar10 = uVar13 + (int)uVar14;
      if (((int)uVar10 < 0) || (p->vCis->nSize <= (int)uVar10)) goto LAB_007b6d81;
      iVar17 = p->vCis->pArray[uVar10];
      if (((long)iVar17 < 0) || (uVar12 = (ulong)(uint)p->nObjs, p->nObjs <= iVar17))
      goto LAB_007b6da0;
      pGVar11 = p->pObjs;
      pGVar11[iVar17].Value = uVar5;
      uVar14 = uVar14 + 1;
    } while ((int)uVar14 < nBarBufs);
  }
  else {
    uVar14 = uVar18 & 0xffffffff;
  }
  if ((int)uVar14 != nBarBufs) {
    __assert_fail("k == nBarBufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x152,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  uVar5 = iVar1 - nBarBufs;
  if (0 < (int)uVar5) {
    uVar12 = (ulong)(uint)nBarBufs;
    uVar18 = (ulong)uVar5;
    do {
      if ((nBarBufs < 0) || (p->vCos->nSize <= (int)uVar12)) {
LAB_007b6d81:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar17 = p->vCos->pArray[uVar12];
      if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) {
LAB_007b6da0:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar15 = (uint)*(undefined8 *)(p->pObjs + iVar17);
      uVar10 = (p->pObjs + iVar17)[-(ulong)(uVar15 & 0x1fffffff)].Value;
      if ((int)uVar10 < 0) {
LAB_007b6dbf:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar15 >> 0x1d & 1 ^ uVar10);
      uVar12 = uVar12 + 1;
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  if (p_00->nBufs != nBarBufs) {
    __assert_fail("Gia_ManBufNum(pNew) == nBarBufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x156,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  if (p_00->vCis->nSize != uVar13) {
    __assert_fail("Gia_ManCiNum(pNew) == nPiReal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x157,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  if (p_00->vCos->nSize != uVar5) {
    __assert_fail("Gia_ManCoNum(pNew) == nPoReal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x158,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupToBarBufs( Gia_Man_t * p, int nBarBufs )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int nPiReal = Gia_ManCiNum(p) - nBarBufs;
    int nPoReal = Gia_ManCoNum(p) - nBarBufs;
    int i, k = 0;
    assert( Gia_ManBufNum(p) == 0 );
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManHasChoices(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < nPiReal; i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        for ( ; k < nBarBufs; k++ )
            if ( ~Gia_ObjFanin0(Gia_ManCo(p, k))->Value )
                Gia_ManCi(p, nPiReal + k)->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p, k)) );
            else
                break;
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
            pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))->Value);  
    }
    for ( ; k < nBarBufs; k++ )
        if ( ~Gia_ObjFanin0Copy(Gia_ManCo(p, k)) )
            Gia_ManCi(p, nPiReal + k)->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p, k)) );
    assert( k == nBarBufs );
    for ( i = 0; i < nPoReal; i++ )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p, nBarBufs+i)) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    assert( Gia_ManBufNum(pNew) == nBarBufs );
    assert( Gia_ManCiNum(pNew) == nPiReal );
    assert( Gia_ManCoNum(pNew) == nPoReal );
    return pNew;
}